

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_set.c
# Opt level: O2

int mpt_path_set(mpt_path *path,char *val,int len)

{
  char cVar1;
  char cVar2;
  char cVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  uint8_t uVar9;
  ulong uVar10;
  int iVar11;
  
  cVar1 = path->sep;
  cVar2 = path->assign;
  iVar11 = 0;
  if (val == (char *)0x0) {
    lVar8 = 0;
    uVar6 = 0;
  }
  else {
    if (len < 0) {
      sVar4 = strlen(val);
      uVar6 = sVar4 + 1;
    }
    else {
      uVar6 = (ulong)(uint)len;
    }
    lVar8 = 1;
  }
  uVar10 = 0;
  uVar5 = 0;
  do {
    if (uVar6 == uVar5) {
LAB_0010db01:
      mpt_path_fini(path);
      path->base = val;
      path->off = 0;
      path->len = lVar8 + uVar6;
      uVar9 = (uint8_t)uVar10;
      if (0xff < uVar10) {
        uVar9 = '\0';
      }
      path->first = uVar9;
      path->sep = cVar1;
      path->assign = cVar2;
      path->flags = '\0';
      return iVar11;
    }
    cVar3 = val[uVar5];
    if (cVar3 == cVar2) {
      iVar11 = iVar11 + 1;
      uVar6 = uVar5 + 1;
      lVar8 = 0;
      goto LAB_0010db01;
    }
    uVar7 = uVar10;
    if (iVar11 == 0) {
      uVar7 = uVar5;
    }
    if (cVar3 == cVar1) {
      uVar10 = uVar7;
    }
    iVar11 = iVar11 + (uint)(cVar3 == cVar1);
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

extern int mpt_path_set(MPT_STRUCT(path) *path, const char *val, int len)
{
	size_t vlen, plen = 0, first = 0, add = 1;
	int elem = 0;
	char sep, assign;
	
	sep = path->sep;
	assign = path->assign;
	
	if (!val) {
		vlen = add = 0;
	} else {
		vlen = (len < 0) ? strlen(val) + 1 : (size_t) len;
	}
	
	while (plen < vlen) {
		char curr = val[plen++];
		
		/* inline assignment */
		if (curr == assign) {
			add = 0;
			++elem;
			break;
		}
		/* separator found, save length of first part */
		if ((curr == sep) && !elem++) {
			first = plen - 1;
		}
	}
	mpt_path_fini(path);
	
	path->base = val;
	path->off  = 0;
	path->len  = plen + add;
	
	path->first  = (first > UINT8_MAX) ? 0 : first;
	path->sep    = sep;
	path->assign = assign;
	path->flags  = 0;
	
	return elem;
}